

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<long>::Visit
          (PrecomputeVisitor<long> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  bool bVar1;
  BinaryType BVar2;
  element_type *peVar3;
  shared_ptr<const_calc4::Operator> *in_RDI;
  long result;
  long rightValue;
  long leftValue;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  shared_ptr<const_calc4::BinaryOperator> *in_stack_ffffffffffffff68;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  BinaryType in_stack_ffffffffffffff8c;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff90;
  PrecomputeVisitor<long> *in_stack_ffffffffffffff98;
  long local_50;
  
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x140761);
  BinaryOperator::GetLeft(peVar3);
  Precompute((PrecomputeVisitor<long> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x140788);
  BinaryOperator::GetRight(peVar3);
  Precompute((PrecomputeVisitor<long> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  bVar1 = TryGetPrecomputedValue
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if ((bVar1) &&
     (bVar1 = TryGetPrecomputedValue
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         (long *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
     bVar1)) {
    peVar3 = std::
             __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1407ff);
    BVar2 = BinaryOperator::GetType(peVar3);
    if (BVar2 != Div) {
      peVar3 = std::
               __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x140819);
      BVar2 = BinaryOperator::GetType(peVar3);
      if (BVar2 != Mod) goto LAB_00140832;
    }
    if (local_50 != 0) {
LAB_00140832:
      peVar3 = std::
               __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14083f);
      BVar2 = BinaryOperator::GetType(peVar3);
      (*(code *)(&DAT_0018bfac + *(int *)(&DAT_0018bfac + (ulong)BVar2 * 4)))();
      return;
    }
  }
  peVar3 = std::
           __shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1409ff);
  BinaryOperator::GetType(peVar3);
  BinaryOperator::Create
            ((shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::shared_ptr<calc4::Operator_const>::operator=
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::shared_ptr<const_calc4::BinaryOperator>::~shared_ptr
            ((shared_ptr<const_calc4::BinaryOperator> *)0x140a3c);
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x140a46)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x140a50)
  ;
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }